

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall deqp::gls::MemObjectAllocator::~MemObjectAllocator(MemObjectAllocator *this)

{
  MemObjectAllocator *this_local;
  
  TextureRenderer::~TextureRenderer(&this->m_textureRenderer);
  BufferRenderer::~BufferRenderer(&this->m_bufferRenderer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_dummyData);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_buffers);
  return;
}

Assistant:

MemObjectAllocator::~MemObjectAllocator (void)
{
}